

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O0

void __thiscall cppnet::Dispatcher::Run(Dispatcher *this)

{
  bool bVar1;
  uint uVar2;
  id iVar3;
  uint64_t uVar4;
  element_type *peVar5;
  element_type *peVar6;
  uint64_t cur_time;
  int32_t wait_time;
  Dispatcher *this_local;
  
  iVar3 = std::this_thread::get_id();
  (this->_local_thread_id)._M_thread = iVar3._M_thread;
  uVar4 = UTCTimeMsec();
  this->_cur_utc_time = uVar4;
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&(this->super_Thread)._stop);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    uVar4 = UTCTimeMsec();
    peVar5 = std::__shared_ptr_access<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_timer);
    (*peVar5->_vptr_Timer[4])(peVar5,(ulong)(uint)((int)uVar4 - (int)this->_cur_utc_time));
    this->_cur_utc_time = uVar4;
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&(this->super_Thread)._stop);
    if (bVar1) break;
    peVar5 = std::__shared_ptr_access<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_timer);
    uVar2 = (*peVar5->_vptr_Timer[2])();
    peVar6 = std::
             __shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_event_actions);
    (*peVar6->_vptr_EventActions[10])(peVar6,(ulong)uVar2);
    DoTask(this);
  }
  return;
}

Assistant:

void Dispatcher::Run() {
    _local_thread_id = std::this_thread::get_id();
    _cur_utc_time = UTCTimeMsec();
    int32_t wait_time = 0;
    uint64_t cur_time = 0;

    while (!_stop) {
        cur_time = UTCTimeMsec();
        _timer->TimerRun(uint32_t(cur_time - _cur_utc_time));
        _cur_utc_time = cur_time;

        if (_stop) {
            break;
        }

        wait_time = _timer->MinTime();

        _event_actions->ProcessEvent(wait_time);

        DoTask();
    }
}